

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O0

int __thiscall capnp::TwoPartyServer::listen(TwoPartyServer *this,int __fd,int __n)

{
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  Type local_28;
  ConnectionReceiver *listener_local;
  TwoPartyServer *this_local;
  
  listener_local = (ConnectionReceiver *)CONCAT44(in_register_00000034,__fd);
  local_28.listener = (ConnectionReceiver *)CONCAT44(in_register_00000014,__n);
  this_local = this;
  (**(local_28.listener)->_vptr_ConnectionReceiver)();
  kj::Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>::
  then<capnp::TwoPartyServer::listen(kj::ConnectionReceiver&)::__0>
            ((Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>> *)this,&local_28);
  kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::~Promise
            ((Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&local_28);
  return (int)this;
}

Assistant:

kj::Promise<void> TwoPartyServer::listen(kj::ConnectionReceiver& listener) {
  return listener.accept()
      .then([this,&listener](kj::Own<kj::AsyncIoStream>&& connection) mutable {
    accept(kj::mv(connection));
    return listen(listener);
  });
}